

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertMaterial
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *mat_abs_path,
          Material *material,RenderMaterial *rmat_out)

{
  Stage *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *__x;
  size_type sVar4;
  reference rhs;
  Shader *pSVar5;
  UsdPreviewSurface *shader_00;
  RenderMaterial *args_1;
  string local_14c0;
  allocator local_1499;
  string local_1498 [32];
  fmt local_1478 [32];
  ostringstream local_1458 [8];
  ostringstream ss_e_7;
  undefined1 local_12e0 [8];
  PreviewSurfaceShader pss;
  string local_1228;
  allocator local_1201;
  string local_1200 [32];
  string local_11e0;
  ostringstream local_11c0 [8];
  ostringstream ss_e_6;
  string local_1048;
  allocator local_1021;
  string local_1020 [32];
  fmt local_1000 [32];
  ostringstream local_fe0 [8];
  ostringstream ss_e_5;
  UsdPreviewSurface *psurface;
  allocator local_e39;
  string local_e38 [32];
  fmt local_e18 [32];
  ostringstream local_df8 [8];
  ostringstream ss_e_4;
  Shader *shader;
  ostringstream local_c58 [8];
  ostringstream ss_e_3;
  string local_ae0;
  string local_ac0;
  allocator local_a99;
  string local_a98 [32];
  fmt local_a78 [32];
  ostringstream local_a58 [8];
  ostringstream ss_e_2;
  allocator local_8d9;
  string local_8d8;
  Path local_8b8;
  Prim *local_7e8;
  Prim *shaderPrim;
  string local_7c0;
  allocator local_799;
  string local_798 [32];
  fmt local_778 [32];
  ostringstream local_758 [8];
  ostringstream ss_w;
  string local_5d8;
  string local_5b8;
  allocator local_591;
  string local_590 [32];
  fmt local_570 [32];
  ostringstream local_550 [8];
  ostringstream ss_e_1;
  undefined1 local_3d8 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> paths;
  Path surfacePath;
  string err;
  RenderMaterial rmat;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  RenderMaterial *rmat_out_local;
  Material *material_local;
  Path *mat_abs_path_local;
  RenderSceneConverterEnv *env_local;
  RenderSceneConverter *this_local;
  
  if (rmat_out == (RenderMaterial *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1389);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"rmat_out argument is nullptr.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&rmat.handle);
    ::std::__cxx11::string::~string((string *)&rmat.handle);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  else {
    args_1 = rmat_out;
    RenderMaterial::RenderMaterial((RenderMaterial *)((long)&err.field_2 + 8));
    psVar3 = Path::prim_part_abi_cxx11_(mat_abs_path);
    ::std::__cxx11::string::operator=
              ((string *)(rmat.name.field_2._M_local_buf + 8),(string *)psVar3);
    psVar3 = Path::element_name_abi_cxx11_(mat_abs_path);
    ::std::__cxx11::string::operator=((string *)(err.field_2._M_local_buf + 8),(string *)psVar3);
    ::std::__cxx11::string::string((string *)&surfacePath._valid);
    Path::Path((Path *)&paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = TypedConnection<tinyusdz::Token>::authored(&material->surface);
    if (bVar1) {
      __x = TypedConnection<tinyusdz::Token>::get_connections(&material->surface);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d8,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)__x);
      sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d8);
      if (sVar4 == 1) {
        rhs = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d8,0);
        Path::operator=((Path *)&paths.
                                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,rhs);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_550);
        poVar2 = ::std::operator<<((ostream *)local_550,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x139f);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_590,"{}\'s outputs:surface must be connection with single target Path.\n",
                   &local_591);
        Path::full_path_name_abi_cxx11_(&local_5b8,mat_abs_path);
        fmt::format<std::__cxx11::string>
                  (local_570,(string *)local_590,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8);
        poVar2 = ::std::operator<<((ostream *)local_550,(string *)local_570);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_570);
        ::std::__cxx11::string::~string((string *)&local_5b8);
        ::std::__cxx11::string::~string(local_590);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_591);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_5d8);
        ::std::__cxx11::string::~string((string *)&local_5d8);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_550);
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d8);
      if (sVar4 == 1) {
        local_7e8 = (Prim *)0x0;
        this_00 = env->stage;
        psVar3 = Path::prim_part_abi_cxx11_
                           ((Path *)&paths.
                                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_8d8,"",&local_8d9);
        Path::Path(&local_8b8,psVar3,&local_8d8);
        bVar1 = Stage::find_prim_at_path
                          (this_00,&local_8b8,&local_7e8,(string *)&surfacePath._valid);
        Path::~Path(&local_8b8);
        ::std::__cxx11::string::~string((string *)&local_8d8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          if (local_7e8 == (Prim *)0x0) {
            ::std::__cxx11::ostringstream::ostringstream(local_c58);
            poVar2 = ::std::operator<<((ostream *)local_c58,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13bd);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_c58,"[InternalError] invalid Shader Prim.\n"
                                      );
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&shader);
            ::std::__cxx11::string::~string((string *)&shader);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_c58);
          }
          else {
            pSVar5 = Prim::as<tinyusdz::Shader>(local_7e8);
            if (pSVar5 == (Shader *)0x0) {
              ::std::__cxx11::ostringstream::ostringstream(local_df8);
              poVar2 = ::std::operator<<((ostream *)local_df8,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13c6);
              ::std::operator<<(poVar2," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_e38,
                         "{}\'s outputs:surface must be connected to Shader Prim, but connected to `{}` Prim.\n"
                         ,&local_e39);
              psVar3 = Prim::prim_type_name_abi_cxx11_(local_7e8);
              fmt::format<std::__cxx11::string>
                        (local_e18,(string *)local_e38,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3
                        );
              poVar2 = ::std::operator<<((ostream *)local_df8,(string *)local_e18);
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::string::~string((string *)local_e18);
              ::std::__cxx11::string::~string(local_e38);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_e39);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)&psurface);
              ::std::__cxx11::string::~string((string *)&psurface);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_df8);
            }
            else {
              shader_00 = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>
                                    (&pSVar5->value,false);
              if (shader_00 == (UsdPreviewSurface *)0x0) {
                ::std::__cxx11::ostringstream::ostringstream(local_fe0);
                poVar2 = ::std::operator<<((ostream *)local_fe0,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13ce);
                ::std::operator<<(poVar2," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1020,"Shader\'s info:id must be UsdPreviewSurface, but got {}",
                           &local_1021);
                fmt::format<std::__cxx11::string>
                          (local_1000,(string *)local_1020,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pSVar5->info_id);
                poVar2 = ::std::operator<<((ostream *)local_fe0,(string *)local_1000);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string((string *)local_1000);
                ::std::__cxx11::string::~string(local_1020);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1021);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_1048);
                ::std::__cxx11::string::~string((string *)&local_1048);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_fe0);
              }
              else {
                psVar3 = Path::prop_part_abi_cxx11_
                                   ((Path *)&paths.
                                             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                bVar1 = ::std::operator!=(psVar3,"outputs:surface");
                if (bVar1) {
                  ::std::__cxx11::ostringstream::ostringstream(local_11c0);
                  poVar2 = ::std::operator<<((ostream *)local_11c0,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13d6);
                  ::std::operator<<(poVar2," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_1200,
                             "{}\'s outputs:surface connection must point to property `outputs:surface`, but got `{}`"
                             ,&local_1201);
                  Path::full_path_name_abi_cxx11_(&local_1228,mat_abs_path);
                  psVar3 = Path::prop_part_abi_cxx11_
                                     ((Path *)&paths.
                                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            (&local_11e0,(fmt *)local_1200,&local_1228,psVar3,&args_1->name);
                  poVar2 = ::std::operator<<((ostream *)local_11c0,(string *)&local_11e0);
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::string::~string((string *)&local_11e0);
                  ::std::__cxx11::string::~string((string *)&local_1228);
                  ::std::__cxx11::string::~string(local_1200);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_1201);
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)&pss.handle);
                  ::std::__cxx11::string::~string((string *)&pss.handle);
                  this_local._7_1_ = 0;
                  ::std::__cxx11::ostringstream::~ostringstream(local_11c0);
                }
                else {
                  PreviewSurfaceShader::PreviewSurfaceShader((PreviewSurfaceShader *)local_12e0);
                  bVar1 = ConvertPreviewSurfaceShader
                                    (this,env,(Path *)&paths.
                                                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                     ,shader_00,(PreviewSurfaceShader *)local_12e0);
                  if (bVar1) {
                    memcpy((void *)((long)&rmat.display_name.field_2 + 8),local_12e0,0x98);
                    RenderMaterial::operator=(rmat_out,(RenderMaterial *)((long)&err.field_2 + 8));
                    this_local._7_1_ = 1;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_1458);
                    poVar2 = ::std::operator<<((ostream *)local_1458,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13dc);
                    ::std::operator<<(poVar2," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1498,"Failed to convert UsdPreviewSurface : {}",&local_1499);
                    psVar3 = Path::prim_part_abi_cxx11_
                                       ((Path *)&paths.
                                                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                    ;
                    fmt::format<std::__cxx11::string>
                              (local_1478,(string *)local_1498,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar3);
                    poVar2 = ::std::operator<<((ostream *)local_1458,(string *)local_1478);
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::string::~string((string *)local_1478);
                    ::std::__cxx11::string::~string(local_1498);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1499);
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_14c0);
                    ::std::__cxx11::string::~string((string *)&local_14c0);
                    this_local._7_1_ = 0;
                    ::std::__cxx11::ostringstream::~ostringstream(local_1458);
                  }
                }
              }
            }
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_a58);
          poVar2 = ::std::operator<<((ostream *)local_a58,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13b8);
          ::std::operator<<(poVar2," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_a98,"{}\'s outputs:surface isn\'t connected to exising Prim path.\n",
                     &local_a99);
          Path::full_path_name_abi_cxx11_(&local_ac0,mat_abs_path);
          fmt::format<std::__cxx11::string>
                    (local_a78,(string *)local_a98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ac0
                    );
          poVar2 = ::std::operator<<((ostream *)local_a58,(string *)local_a78);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::~string((string *)local_a78);
          ::std::__cxx11::string::~string((string *)&local_ac0);
          ::std::__cxx11::string::~string(local_a98);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a99);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_ae0);
          ::std::__cxx11::string::~string((string *)&local_ae0);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_a58);
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_758);
      poVar2 = ::std::operator<<((ostream *)local_758,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ConvertMaterial");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13a7);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_798,
                 "{}\'s outputs:surface isn\'t authored, so not a valid Material/Shader. Create a default Material\n"
                 ,&local_799);
      Path::full_path_name_abi_cxx11_(&local_7c0,mat_abs_path);
      fmt::format<std::__cxx11::string>
                (local_778,(string *)local_798,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7c0);
      poVar2 = ::std::operator<<((ostream *)local_758,(string *)local_778);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_778);
      ::std::__cxx11::string::~string((string *)&local_7c0);
      ::std::__cxx11::string::~string(local_798);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_799);
      ::std::__cxx11::ostringstream::str();
      PushWarn(this,(string *)&shaderPrim);
      ::std::__cxx11::string::~string((string *)&shaderPrim);
      ::std::__cxx11::ostringstream::~ostringstream(local_758);
      RenderMaterial::operator=(rmat_out,(RenderMaterial *)((long)&err.field_2 + 8));
      this_local._7_1_ = 1;
    }
    Path::~Path((Path *)&paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string((string *)&surfacePath._valid);
    RenderMaterial::~RenderMaterial((RenderMaterial *)((long)&err.field_2 + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RenderSceneConverter::ConvertMaterial(const RenderSceneConverterEnv &env,
                                           const Path &mat_abs_path,
                                           const tinyusdz::Material &material,
                                           RenderMaterial *rmat_out) {
  if (!rmat_out) {
    PUSH_ERROR_AND_RETURN("rmat_out argument is nullptr.");
  }

  RenderMaterial rmat;
  rmat.abs_path = mat_abs_path.prim_part();
  rmat.name = mat_abs_path.element_name();
  DCOUT("rmat.abs_path = " << rmat.abs_path);
  DCOUT("rmat.name = " << rmat.name);
  std::string err;
  Path surfacePath;

  //
  // surface shader
  {
    if (material.surface.authored()) {
      auto paths = material.surface.get_connections();
      DCOUT("paths = " << paths);
      // must have single targetPath.
      if (paths.size() != 1) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("{}'s outputs:surface must be connection with single "
                        "target Path.\n",
                        mat_abs_path.full_path_name()));
      }
      surfacePath = paths[0];
    } else {
      // May be PhysicsMaterial?
      // Create dummy material

      PUSH_WARN(fmt::format("{}'s outputs:surface isn't authored, so not a valid Material/Shader. Create a default Material\n",
                      mat_abs_path.full_path_name()));


      (*rmat_out) = rmat;
      return true;

      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface isn't authored.\n",
                      mat_abs_path.full_path_name()));
    }

    const Prim *shaderPrim{nullptr};
    if (!env.stage.find_prim_at_path(
            Path(surfacePath.prim_part(), /* prop part */ ""), shaderPrim,
            &err)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "{}'s outputs:surface isn't connected to exising Prim path.\n",
          mat_abs_path.full_path_name()));
    }

    if (!shaderPrim) {
      // this should not happen though.
      PUSH_ERROR_AND_RETURN("[InternalError] invalid Shader Prim.\n");
    }

    const Shader *shader = shaderPrim->as<Shader>();

    if (!shader) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface must be connected to Shader Prim, "
                      "but connected to `{}` Prim.\n",
                      shaderPrim->prim_type_name()));
    }

    // Currently must be UsdPreviewSurface
    const UsdPreviewSurface *psurface = shader->value.as<UsdPreviewSurface>();
    if (!psurface) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Shader's info:id must be UsdPreviewSurface, but got {}",
                      shader->info_id));
    }

    // prop part must be `outputs:surface` for now.
    if (surfacePath.prop_part() != "outputs:surface") {
      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface connection must point to property "
                      "`outputs:surface`, but got `{}`",
                      mat_abs_path.full_path_name(), surfacePath.prop_part()));
    }

    PreviewSurfaceShader pss;
    if (!ConvertPreviewSurfaceShader(env, surfacePath, *psurface, &pss)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to convert UsdPreviewSurface : {}", surfacePath.prim_part()));
    }

    rmat.surfaceShader = pss;
  }

  DCOUT("Converted Material: " << mat_abs_path);

  (*rmat_out) = rmat;
  return true;
}